

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void vsencoding::__vseblocks_unpack2(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint32_t bs_local;
  uint32_t *in_local;
  uint32_t *out_local;
  
  in_local = in;
  out_local = out;
  for (bs_local = bs + 0x1f >> 5; bs_local != 0; bs_local = bs_local - 1) {
    *out_local = *in_local >> 0x1e;
    out_local[1] = *in_local >> 0x1c & 3;
    out_local[2] = *in_local >> 0x1a & 3;
    out_local[3] = *in_local >> 0x18 & 3;
    out_local[4] = *in_local >> 0x16 & 3;
    out_local[5] = *in_local >> 0x14 & 3;
    out_local[6] = *in_local >> 0x12 & 3;
    out_local[7] = *in_local >> 0x10 & 3;
    out_local[8] = *in_local >> 0xe & 3;
    out_local[9] = *in_local >> 0xc & 3;
    out_local[10] = *in_local >> 10 & 3;
    out_local[0xb] = *in_local >> 8 & 3;
    out_local[0xc] = *in_local >> 6 & 3;
    out_local[0xd] = *in_local >> 4 & 3;
    out_local[0xe] = *in_local >> 2 & 3;
    out_local[0xf] = *in_local & 3;
    out_local[0x10] = in_local[1] >> 0x1e;
    out_local[0x11] = in_local[1] >> 0x1c & 3;
    out_local[0x12] = in_local[1] >> 0x1a & 3;
    out_local[0x13] = in_local[1] >> 0x18 & 3;
    out_local[0x14] = in_local[1] >> 0x16 & 3;
    out_local[0x15] = in_local[1] >> 0x14 & 3;
    out_local[0x16] = in_local[1] >> 0x12 & 3;
    out_local[0x17] = in_local[1] >> 0x10 & 3;
    out_local[0x18] = in_local[1] >> 0xe & 3;
    out_local[0x19] = in_local[1] >> 0xc & 3;
    out_local[0x1a] = in_local[1] >> 10 & 3;
    out_local[0x1b] = in_local[1] >> 8 & 3;
    out_local[0x1c] = in_local[1] >> 6 & 3;
    out_local[0x1d] = in_local[1] >> 4 & 3;
    out_local[0x1e] = in_local[1] >> 2 & 3;
    out_local[0x1f] = in_local[1] & 3;
    out_local = out_local + 0x20;
    in_local = in_local + 2;
  }
  return;
}

Assistant:

void __vseblocks_unpack2(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  // for (uint32_t i = 0; i < bs; i += 32, out += 32, in += 2) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 2, --bs) {
    out[0] = in[0] >> 30;
    out[1] = (in[0] >> 28) & 0x03;
    out[2] = (in[0] >> 26) & 0x03;
    out[3] = (in[0] >> 24) & 0x03;
    out[4] = (in[0] >> 22) & 0x03;
    out[5] = (in[0] >> 20) & 0x03;
    out[6] = (in[0] >> 18) & 0x03;
    out[7] = (in[0] >> 16) & 0x03;
    out[8] = (in[0] >> 14) & 0x03;
    out[9] = (in[0] >> 12) & 0x03;
    out[10] = (in[0] >> 10) & 0x03;
    out[11] = (in[0] >> 8) & 0x03;
    out[12] = (in[0] >> 6) & 0x03;
    out[13] = (in[0] >> 4) & 0x03;
    out[14] = (in[0] >> 2) & 0x03;
    out[15] = in[0] & 0x03;
    out[16] = in[1] >> 30;
    out[17] = (in[1] >> 28) & 0x03;
    out[18] = (in[1] >> 26) & 0x03;
    out[19] = (in[1] >> 24) & 0x03;
    out[20] = (in[1] >> 22) & 0x03;
    out[21] = (in[1] >> 20) & 0x03;
    out[22] = (in[1] >> 18) & 0x03;
    out[23] = (in[1] >> 16) & 0x03;
    out[24] = (in[1] >> 14) & 0x03;
    out[25] = (in[1] >> 12) & 0x03;
    out[26] = (in[1] >> 10) & 0x03;
    out[27] = (in[1] >> 8) & 0x03;
    out[28] = (in[1] >> 6) & 0x03;
    out[29] = (in[1] >> 4) & 0x03;
    out[30] = (in[1] >> 2) & 0x03;
    out[31] = in[1] & 0x03;
  }
}